

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

sparse_bit_array * __thiscall
crnlib::sparse_bit_array::operator=(sparse_bit_array *this,sparse_bit_array *other)

{
  uint32 **ppuVar1;
  uint32 *puVar2;
  uint local_24;
  uint i;
  sparse_bit_array *other_local;
  sparse_bit_array *this_local;
  
  if (this != other) {
    if (this->m_num_groups != other->m_num_groups) {
      clear(this);
      this->m_num_groups = other->m_num_groups;
      ppuVar1 = (uint32 **)crnlib_calloc((ulong)this->m_num_groups,8,(size_t *)0x0);
      this->m_ppGroups = ppuVar1;
      if (this->m_ppGroups == (uint32 **)0x0) {
        crnlib_assert("m_ppGroups",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                      ,0x50);
      }
    }
    for (local_24 = 0; local_24 < this->m_num_groups; local_24 = local_24 + 1) {
      if (other->m_ppGroups[local_24] == (uint32 *)0x0) {
        if (this->m_ppGroups[local_24] != (uint32 *)0x0) {
          free_group(this->m_ppGroups[local_24]);
          this->m_ppGroups[local_24] = (uint32 *)0x0;
        }
      }
      else {
        if (this->m_ppGroups[local_24] == (uint32 *)0x0) {
          puVar2 = alloc_group(false);
          this->m_ppGroups[local_24] = puVar2;
        }
        memcpy(this->m_ppGroups[local_24],other->m_ppGroups[local_24],0x40);
      }
    }
  }
  return this;
}

Assistant:

sparse_bit_array& sparse_bit_array::operator=(sparse_bit_array& other)
    {
        if (this == &other)
        {
            return *this;
        }

        if (m_num_groups != other.m_num_groups)
        {
            clear();

            m_num_groups = other.m_num_groups;
            m_ppGroups = (uint32**)crnlib_calloc(m_num_groups, sizeof(uint32*));
            CRNLIB_VERIFY(m_ppGroups);
        }

        for (uint i = 0; i < m_num_groups; i++)
        {
            if (other.m_ppGroups[i])
            {
                if (!m_ppGroups[i])
                {
                    m_ppGroups[i] = alloc_group(false);
                }
                memcpy(m_ppGroups[i], other.m_ppGroups[i], cBytesPerGroup);
            }
            else if (m_ppGroups[i])
            {
                free_group(m_ppGroups[i]);
                m_ppGroups[i] = nullptr;
            }
        }

        return *this;
    }